

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int thread_peak_read_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  uint64_t local_20;
  
  iVar2 = 1;
  if (newp == (void *)0x0 && newlen == 0) {
    duckdb_je_peak_event_update(tsd);
    local_20 = duckdb_je_peak_event_max(tsd);
    iVar2 = 0;
    if (oldlenp != (size_t *)0x0 && oldp != (void *)0x0) {
      uVar1 = *oldlenp;
      if (uVar1 == 8) {
        *(uint64_t *)oldp = local_20;
        iVar2 = 0;
      }
      else {
        __n = 8;
        if (uVar1 < 8) {
          __n = uVar1;
        }
        switchD_012bc561::default(oldp,&local_20,__n);
        *oldlenp = __n;
        iVar2 = 0x16;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
thread_peak_read_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	if (!config_stats) {
		return ENOENT;
	}
	READONLY();
	peak_event_update(tsd);
	uint64_t result = peak_event_max(tsd);
	READ(result, uint64_t);
	ret = 0;
label_return:
	return ret;
}